

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

IceTImage icetInvokeStrategy(IceTEnum strategy)

{
  IceTImage IStack_10;
  IceTEnum strategy_local;
  
  if (strategy == 0xffffffff) {
    icetRaiseDiagnostic("Strategy not defined. Use icetStrategy to set the strategy.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/select.c"
                        ,0x76);
    IStack_10 = icetImageNull();
  }
  else if (strategy == 0x6001) {
    IStack_10 = icetDirectCompose();
  }
  else if (strategy == 0x6002) {
    IStack_10 = icetSequentialCompose();
  }
  else if (strategy == 0x6003) {
    IStack_10 = icetSplitCompose();
  }
  else if (strategy == 0x6004) {
    IStack_10 = icetReduceCompose();
  }
  else if (strategy == 0x6005) {
    IStack_10 = icetVtreeCompose();
  }
  else {
    icetRaiseDiagnostic("Invalid strategy.",0xfffffffe,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/strategies/select.c"
                        ,0x79);
    IStack_10 = icetImageNull();
  }
  return (IceTImage)IStack_10.opaque_internals;
}

Assistant:

IceTImage icetInvokeStrategy(IceTEnum strategy)
{
    icetRaiseDebug1("Invoking strategy %s",
                    icetStrategyNameFromEnum(strategy));

    switch (strategy) {
      case ICET_STRATEGY_DIRECT:        return icetDirectCompose();
      case ICET_STRATEGY_SEQUENTIAL:    return icetSequentialCompose();
      case ICET_STRATEGY_SPLIT:         return icetSplitCompose();
      case ICET_STRATEGY_REDUCE:        return icetReduceCompose();
      case ICET_STRATEGY_VTREE:         return icetVtreeCompose();
      case ICET_STRATEGY_UNDEFINED:
          icetRaiseError("Strategy not defined. "
                         "Use icetStrategy to set the strategy.",
                         ICET_INVALID_ENUM);
          return icetImageNull();
      default:
          icetRaiseError("Invalid strategy.", ICET_INVALID_ENUM);
          return icetImageNull();
    }
}